

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_compress.hpp
# Opt level: O3

void duckdb::PatasFinalizeCompress<float>(CompressionState *state_p)

{
  InternalException *this;
  string local_40;
  
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Patas has been deprecated, can no longer be used to compress data"
             ,"");
  InternalException::InternalException(this,&local_40);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void PatasFinalizeCompress(CompressionState &state_p) {
	throw InternalException("Patas has been deprecated, can no longer be used to compress data");
}